

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr xmlCreateURLParserCtxt(char *filename,int options)

{
  int iVar1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *filename_local;
  
  filename_local = (char *)xmlNewParserCtxt();
  if ((xmlParserCtxtPtr)filename_local == (xmlParserCtxtPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    xmlCtxtUseOptions((xmlParserCtxtPtr)filename_local,options | 0x1000000);
    ((xmlParserCtxtPtr)filename_local)->linenumbers = 1;
    value = xmlLoadResource((xmlParserCtxtPtr)filename_local,filename,(char *)0x0,
                            XML_RESOURCE_MAIN_DOCUMENT);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)filename_local);
      filename_local = (char *)0x0;
    }
    else {
      iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)filename_local,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        xmlFreeParserCtxt((xmlParserCtxtPtr)filename_local);
        filename_local = (char *)0x0;
      }
    }
  }
  return (xmlParserCtxtPtr)filename_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateURLParserCtxt(const char *filename, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    options |= XML_PARSE_UNZIP;

    xmlCtxtUseOptions(ctxt, options);
    ctxt->linenumbers = 1;

    input = xmlLoadResource(ctxt, filename, NULL, XML_RESOURCE_MAIN_DOCUMENT);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}